

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void rw::Frame::syncDirty(void)

{
  byte hierarchyFlags;
  LLLink *pLVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  ObjectWithFrame *pOVar4;
  EVP_PKEY_CTX *in_RSI;
  LLLink *local_40;
  LLLink *lnk_2;
  LLLink *_next_2;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  Frame *frame;
  
  _next_1 = *(LLLink **)(engine + 0x10);
  while( true ) {
    pLVar1 = _next_1->next;
    pLVar2 = LinkList::end((LinkList *)(engine + 0x10));
    if (_next_1 == pLVar2) break;
    if (((ulong)_next_1[-1].next & 0x1000000) == 0) {
      local_40 = _next_1[1].next;
      while( true ) {
        pLVar2 = local_40->next;
        pLVar3 = LinkList::end((LinkList *)(_next_1 + 1));
        if (local_40 == pLVar3) break;
        pOVar4 = ObjectWithFrame::fromFrame(local_40);
        ObjectWithFrame::sync(pOVar4);
        local_40 = pLVar2;
      }
      syncObjRecurse((Frame *)_next_1[10].next);
    }
    else {
      if (((ulong)_next_1[-1].next & 0x4000000) != 0) {
        memcpy(_next_1 + 6,_next_1 + 2,0x40);
      }
      _next_2 = _next_1[1].next;
      while( true ) {
        pLVar2 = _next_2->next;
        pLVar3 = LinkList::end((LinkList *)(_next_1 + 1));
        if (_next_2 == pLVar3) break;
        pOVar4 = ObjectWithFrame::fromFrame(_next_2);
        ObjectWithFrame::sync(pOVar4);
        _next_2 = pLVar2;
      }
      hierarchyFlags = *(byte *)((long)&_next_1[-1].next + 3);
      in_RSI = (EVP_PKEY_CTX *)(ulong)hierarchyFlags;
      syncRecurse((Frame *)_next_1[10].next,hierarchyFlags);
    }
    *(byte *)((long)&_next_1[-1].next + 3) = *(byte *)((long)&_next_1[-1].next + 3) & 0xf0;
    _next_1 = pLVar1;
  }
  LinkList::init((LinkList *)(engine + 0x10),in_RSI);
  return;
}

Assistant:

void
Frame::syncDirty(void)
{
	Frame *frame;
	FORLIST(lnk, engine->frameDirtyList){
		frame = LLLinkGetData(lnk, Frame, inDirtyList);
		if(frame->object.privateFlags & Frame::HIERARCHYSYNCLTM){
			// Sync root's LTM
			if(frame->object.privateFlags & Frame::SUBTREESYNCLTM)
				frame->ltm = frame->matrix;
			// Synch attached objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			// ...and children
			syncRecurse(frame->child, frame->object.privateFlags);
		}else{
			// LTMs are clean, just synch objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			syncObjRecurse(frame->child);
		}
		// all clean now
		frame->object.privateFlags &= ~(Frame::SYNCLTM | Frame::SYNCOBJ);
	}
	engine->frameDirtyList.init();
}